

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O1

int dwarf_get_ADDR_name(uint val,char **s_out)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = -1;
  if ((int)val < 0x10) {
    if (val == 0) {
      pcVar2 = "DW_ADDR_none";
    }
    else {
      if (val != 8) {
        return -1;
      }
      pcVar2 = "DW_ADDR_TI_PTR8";
    }
  }
  else {
    switch(val) {
    case 0x10:
      pcVar2 = "DW_ADDR_TI_PTR16";
      break;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
      goto switchD_0017f0cf_caseD_11;
    case 0x16:
      pcVar2 = "DW_ADDR_TI_PTR22";
      break;
    case 0x17:
      pcVar2 = "DW_ADDR_TI_PTR23";
      break;
    case 0x18:
      pcVar2 = "DW_ADDR_TI_PTR24";
      break;
    default:
      if (val != 0x20) {
        return -1;
      }
      pcVar2 = "DW_ADDR_TI_PTR32";
    }
  }
  *s_out = pcVar2;
  iVar1 = 0;
switchD_0017f0cf_caseD_11:
  return iVar1;
}

Assistant:

int
dwarf_get_ADDR_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_ADDR_none:
        *s_out = "DW_ADDR_none";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR8:
        *s_out = "DW_ADDR_TI_PTR8";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR16:
        *s_out = "DW_ADDR_TI_PTR16";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR22:
        *s_out = "DW_ADDR_TI_PTR22";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR23:
        *s_out = "DW_ADDR_TI_PTR23";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR24:
        *s_out = "DW_ADDR_TI_PTR24";
        return DW_DLV_OK;
    case DW_ADDR_TI_PTR32:
        *s_out = "DW_ADDR_TI_PTR32";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}